

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_impl.h
# Opt level: O0

Cord ** google::protobuf::internal::TcParser::RefAt<absl::lts_20240722::Cord*>
                  (void *x,size_t offset)

{
  Cord **ppCVar1;
  Cord **target;
  size_t offset_local;
  void *x_local;
  
  ppCVar1 = (Cord **)((long)x + offset);
  if (((ulong)ppCVar1 & 7) != 0) {
    AlignFail(ppCVar1);
    abort();
  }
  return ppCVar1;
}

Assistant:

static inline T& RefAt(void* x, size_t offset) {
    T* target = reinterpret_cast<T*>(static_cast<char*>(x) + offset);
#if !defined(NDEBUG) && !(defined(_MSC_VER) && defined(_M_IX86))
    // Check the alignment in debug mode, except in 32-bit msvc because it does
    // not respect the alignment as expressed by `alignof(T)`
    if (PROTOBUF_PREDICT_FALSE(
            reinterpret_cast<uintptr_t>(target) % alignof(T) != 0)) {
      AlignFail(std::integral_constant<size_t, alignof(T)>(),
                reinterpret_cast<uintptr_t>(target));
      // Explicit abort to let compilers know this code-path does not return
      abort();
    }
#endif
    return *target;
  }